

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SNMP_Agent.cpp
# Opt level: O0

ValueCallback * __thiscall
SNMPAgent::addCounter64Handler(SNMPAgent *this,char *oid,uint64_t *value,bool overwritePrefix)

{
  SortableOIDType *oid_00;
  Counter64Callback *this_00;
  SortableOIDType *oidType;
  bool overwritePrefix_local;
  uint64_t *value_local;
  char *oid_local;
  SNMPAgent *this_local;
  
  if (value == (uint64_t *)0x0) {
    this_local = (SNMPAgent *)0x0;
  }
  else {
    oid_00 = buildOIDWithPrefix(this,oid,overwritePrefix);
    if (oid_00 == (SortableOIDType *)0x0) {
      this_local = (SNMPAgent *)0x0;
    }
    else {
      this_00 = (Counter64Callback *)operator_new(0x20);
      Counter64Callback::Counter64Callback(this_00,oid_00,value);
      this_local = (SNMPAgent *)addHandler(this,(ValueCallback *)this_00,false);
    }
  }
  return (ValueCallback *)this_local;
}

Assistant:

ValueCallback* SNMPAgent::addCounter64Handler(const char *oid, uint64_t* value, bool overwritePrefix){
    if(!value) return nullptr;

    SortableOIDType* oidType = buildOIDWithPrefix(oid, overwritePrefix);
    if(!oidType) return nullptr;
    return addHandler(new Counter64Callback(oidType, value), false);
}